

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O0

int __thiscall fast_float::bigint::compare(bigint *this,bigint *other)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  limb *plVar4;
  limb yi;
  limb xi;
  size_t index;
  bigint *other_local;
  bigint *this_local;
  
  sVar2 = stackvec<(unsigned_short)62>::len(&this->vec);
  sVar3 = stackvec<(unsigned_short)62>::len(&other->vec);
  if (sVar3 < sVar2) {
    this_local._4_4_ = 1;
  }
  else {
    sVar2 = stackvec<(unsigned_short)62>::len(&this->vec);
    sVar3 = stackvec<(unsigned_short)62>::len(&other->vec);
    if (sVar2 < sVar3) {
      this_local._4_4_ = -1;
    }
    else {
      for (xi = stackvec<(unsigned_short)62>::len(&this->vec); xi != 0; xi = xi - 1) {
        plVar4 = stackvec<(unsigned_short)62>::operator[](&this->vec,xi - 1);
        uVar1 = *plVar4;
        plVar4 = stackvec<(unsigned_short)62>::operator[](&other->vec,xi - 1);
        if (*plVar4 < uVar1) {
          return 1;
        }
        if (uVar1 < *plVar4) {
          return -1;
        }
      }
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

FASTFLOAT_CONSTEXPR20 int compare(const bigint& other) const noexcept {
    if (vec.len() > other.vec.len()) {
      return 1;
    } else if (vec.len() < other.vec.len()) {
      return -1;
    } else {
      for (size_t index = vec.len(); index > 0; index--) {
        limb xi = vec[index - 1];
        limb yi = other.vec[index - 1];
        if (xi > yi) {
          return 1;
        } else if (xi < yi) {
          return -1;
        }
      }
      return 0;
    }
  }